

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::_::XThreadEvent_*>::setCapacity(Vector<kj::_::XThreadEvent_*> *this,size_t newSize)

{
  XThreadEvent **ppXVar1;
  ArrayBuilder<kj::_::XThreadEvent_*> newBuilder;
  ArrayBuilder<kj::_::XThreadEvent_*> local_30;
  
  ppXVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppXVar1 >> 3)) {
    (this->builder).pos = ppXVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::_::XThreadEvent*>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::_::XThreadEvent*>::addAll<kj::ArrayBuilder<kj::_::XThreadEvent*>>
            ((ArrayBuilder<kj::_::XThreadEvent*> *)&local_30,&this->builder);
  ArrayBuilder<kj::_::XThreadEvent_*>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::_::XThreadEvent_*>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }